

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_split.cc
# Opt level: O0

string_view __thiscall absl::ByChar::Find(ByChar *this,string_view text,size_t pos)

{
  size_type sVar1;
  const_pointer pvVar2;
  size_type sVar3;
  size_type in_RCX;
  undefined8 in_RDX;
  basic_string_view<char,_std::char_traits<char>_> *in_RSI;
  size_type in_RDI;
  string_view sVar4;
  size_t found_pos;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *local_8;
  basic_string_view<char,_std::char_traits<char>_> in_stack_fffffffffffffff0;
  
  sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                    (this_00,(char)((ulong)in_RDX >> 0x38),(size_type)in_RSI);
  if (sVar1 == 0xffffffffffffffff) {
    pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0
                       );
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffe0)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xfffffffffffffff0,
               pvVar2 + sVar3,0);
  }
  else {
    in_stack_fffffffffffffff0 =
         std::basic_string_view<char,_std::char_traits<char>_>::substr(in_RSI,in_RDI,in_RCX);
  }
  sVar4._M_len = (size_t)this_00;
  sVar4._M_str = local_8;
  return sVar4;
}

Assistant:

absl::string_view ByChar::Find(absl::string_view text, size_t pos) const {
  size_t found_pos = text.find(c_, pos);
  if (found_pos == absl::string_view::npos)
    return absl::string_view(text.data() + text.size(), 0);
  return text.substr(found_pos, 1);
}